

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mklev.c
# Opt level: O0

void sort_rooms(level *lev,int levstyle)

{
  void *__dest;
  void *__base;
  long lVar1;
  mkroom *room;
  int local_40;
  int new_door_index;
  int j;
  int i;
  _func_int_void_ptr_void_ptr *sort_func;
  sort_rooms_data *sortable;
  coord *tmpdoors;
  mkroom *tmprooms;
  int levstyle_local;
  level *lev_local;
  
  if (0 < lev->nroom) {
    switch(levstyle) {
    case 2:
      _j = sort_rooms_ring_comp;
      break;
    case 4:
      return;
    default:
      warning("sort_rooms: unknown levstyle %d",(ulong)(uint)levstyle);
    case 0:
    case 1:
    case 3:
      _j = sort_rooms_standard_comp;
    }
    __dest = xmalloc(lev->nroom * 0xd8);
    memcpy(__dest,lev->rooms,(long)lev->nroom * 0xd8);
    if (lev->doorindex < 1) {
      sortable = (sort_rooms_data *)0x0;
    }
    else {
      sortable = (sort_rooms_data *)xmalloc(lev->doorindex << 1);
      memcpy(sortable,lev->doors,(long)lev->doorindex << 1);
    }
    __base = xmalloc(lev->nroom * 0x14);
    for (new_door_index = 0; new_door_index < lev->nroom; new_door_index = new_door_index + 1) {
      *(int *)((long)__base + (long)new_door_index * 0x14) = new_door_index;
      *(int *)((long)__base + (long)new_door_index * 0x14 + 4) = (int)lev->rooms[new_door_index].lx;
      *(int *)((long)__base + (long)new_door_index * 0x14 + 8) = (int)lev->rooms[new_door_index].ly;
      *(int *)((long)__base + (long)new_door_index * 0x14 + 0xc) =
           (int)lev->rooms[new_door_index].hx;
      *(int *)((long)__base + (long)new_door_index * 0x14 + 0x10) =
           (int)lev->rooms[new_door_index].hy;
    }
    qsort(__base,(long)lev->nroom,0x14,_j);
    room._4_4_ = 0;
    for (new_door_index = 0; new_door_index < lev->nroom; new_door_index = new_door_index + 1) {
      memcpy(lev->rooms + new_door_index,
             (void *)((long)__dest +
                     (long)*(int *)((long)__base + (long)new_door_index * 0x14) * 0xd8),0xd8);
      lVar1 = (long)new_door_index;
      if (sortable != (sort_rooms_data *)0x0) {
        for (local_40 = 0; local_40 < lev->rooms[lVar1].doorct; local_40 = local_40 + 1) {
          lev->doors[room._4_4_ + local_40] =
               *(coord *)((long)&sortable->room_index +
                         (long)(lev->rooms[lVar1].fdoor + local_40) * 2);
        }
        lev->rooms[lVar1].fdoor = (schar)room._4_4_;
        room._4_4_ = lev->rooms[lVar1].doorct + room._4_4_;
      }
    }
  }
  return;
}

Assistant:

void sort_rooms(struct level *lev, int levstyle)
{
	struct mkroom *tmprooms;
	coord *tmpdoors;
	struct sort_rooms_data *sortable;
	int (*sort_func)(const void *, const void *);
	int i, j, new_door_index;

	if (lev->nroom < 1) return;

	/* required for corridors of some level styles */
	switch (levstyle) {
	default:
	    warning("sort_rooms: unknown levstyle %d", levstyle);
	    /* fall through */
	case LEVSTYLE_STANDARD:
	case LEVSTYLE_ANYTOANY:
	case LEVSTYLE_HUB:
	    sort_func = sort_rooms_standard_comp;
	    break;
	case LEVSTYLE_RING:
	    sort_func = sort_rooms_ring_comp;
	    break;
	case LEVSTYLE_GRID:
	    /* no sorting */
	    return;
	}

	/* save rooms and doors in their original order */
	tmprooms = xmalloc(lev->nroom * sizeof(struct mkroom));
	memcpy(tmprooms, lev->rooms, lev->nroom * sizeof(struct mkroom));
	if (lev->doorindex > 0) {
		tmpdoors = xmalloc(lev->doorindex * sizeof(coord));
		memcpy(tmpdoors, lev->doors, lev->doorindex * sizeof(coord));
	} else {
		tmpdoors = NULL;
	}

	/* sort rooms from left to right */
	sortable = xmalloc(lev->nroom * sizeof(struct sort_rooms_data));
	for (i = 0; i < lev->nroom; i++) {
		sortable[i].room_index = i;
		sortable[i].lx = lev->rooms[i].lx;
		sortable[i].ly = lev->rooms[i].ly;
		sortable[i].hx = lev->rooms[i].hx;
		sortable[i].hy = lev->rooms[i].hy;
	}
	qsort(sortable, lev->nroom, sizeof(struct sort_rooms_data), sort_func);

	/* apply room sorting */
	new_door_index = 0;
	for (i = 0; i < lev->nroom; i++) {
		struct mkroom *room;
		lev->rooms[i] = tmprooms[sortable[i].room_index];
		room = &lev->rooms[i];

		/* reorder doors to match sorted room order */
		if (!tmpdoors) continue;
		for (j = 0; j < room->doorct; j++)
			lev->doors[new_door_index + j] = tmpdoors[room->fdoor + j];
		room->fdoor = new_door_index;
		new_door_index += room->doorct;
	}
}